

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O3

Sexp * GcHeap::AllocateFunction(LambdaMeaning *func,Sexp *activation)

{
  Sexp *pSVar1;
  Sexp *local_30;
  Sexp *activation_local;
  FrameProtector __frame_prot;
  
  local_30 = activation;
  FrameProtector::FrameProtector((FrameProtector *)&activation_local,"AllocateFunction");
  FrameProtector::ProtectValue((FrameProtector *)&activation_local,&local_30,"activation");
  if (g_heap == (GcHeap *)0x0) {
    __assert_fail("g_heap != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h"
                  ,0x10a,"static Sexp *GcHeap::AllocateFunction(LambdaMeaning *, Sexp *)");
  }
  if (func != (LambdaMeaning *)0x0) {
    pSVar1 = Allocate(g_heap,false);
    if (pSVar1 != (Sexp *)0x0) {
      pSVar1->kind = FUNCTION;
      (pSVar1->field_1).function.func_meaning = func;
      (pSVar1->field_1).cons.cdr = local_30;
      FrameProtector::~FrameProtector((FrameProtector *)&activation_local);
      return pSVar1;
    }
    __assert_fail("s != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h"
                  ,0x10e,"static Sexp *GcHeap::AllocateFunction(LambdaMeaning *, Sexp *)");
  }
  __assert_fail("func != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h",
                0x10b,"static Sexp *GcHeap::AllocateFunction(LambdaMeaning *, Sexp *)");
}

Assistant:

static Sexp *AllocateFunction(LambdaMeaning *func, Sexp *activation) {
    GC_HELPER_FRAME;
    GC_PROTECT(activation);

    assert(g_heap != nullptr);
    assert(func != nullptr);
    // TODO(segilles) fix the leak
    Sexp *s = g_heap->Allocate(false);
    assert(s != nullptr);
    s->kind = Sexp::Kind::FUNCTION;
    s->function.func_meaning = func;
    s->function.activation = activation;
    return s;
  }